

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_read.cpp
# Opt level: O1

CScript * ParseScript(CScript *__return_storage_ptr__,string *s)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  ulong uVar4;
  char *__first;
  pointer pcVar5;
  uint uVar6;
  _Alloc_hider _Var7;
  undefined8 uVar8;
  bool bVar9;
  int iVar10;
  const_iterator cVar11;
  runtime_error *prVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  long lVar16;
  CScript *pCVar17;
  OpCodeParser *this;
  char *in_R8;
  pointer this_00;
  long in_FS_OFFSET;
  bool bVar18;
  string_view separators;
  string_view str;
  string_view hex_str;
  span<const_std::byte,_18446744073709551615UL> b;
  __integer_from_chars_result_type<long> _Var19;
  vector<unsigned_char,_std::allocator<unsigned_char>_> raw;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  vector<unsigned_char,_std::allocator<unsigned_char>_> value;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  long *local_78;
  size_t local_70;
  long local_68 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 0x10) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 0x18) = 0;
  (__return_storage_ptr__->super_CScriptBase)._union.indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 8) = 0;
  local_58._M_dataplus._M_p = (s->_M_dataplus)._M_p;
  local_58._M_string_length = s->_M_string_length;
  separators._M_str = in_R8;
  separators._M_len = (size_t)" \t\n";
  util::Split<std::__cxx11::string>(&local_90,(util *)&local_58,(Span<const_char> *)0x3,separators);
  if (local_90.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_90.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    paVar2 = &local_58.field_2;
    this_00 = local_90.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      uVar4 = this_00->_M_string_length;
      if (uVar4 != 0) {
        __first = (this_00->_M_dataplus)._M_p;
        pcVar1 = __first + uVar4;
        pcVar13 = __first;
        if (0 < (long)uVar4 >> 2) {
          pcVar13 = __first + (uVar4 & 0xfffffffffffffffc);
          lVar16 = ((long)uVar4 >> 2) + 1;
          pcVar15 = __first + 3;
          do {
            if (9 < (byte)(pcVar15[-3] - 0x30U)) {
              pcVar15 = pcVar15 + -3;
              goto LAB_001417dc;
            }
            if (9 < (byte)(pcVar15[-2] - 0x30U)) {
              pcVar15 = pcVar15 + -2;
              goto LAB_001417dc;
            }
            if (9 < (byte)(pcVar15[-1] - 0x30U)) {
              pcVar15 = pcVar15 + -1;
              goto LAB_001417dc;
            }
            if (9 < (byte)(*pcVar15 - 0x30U)) goto LAB_001417dc;
            lVar16 = lVar16 + -1;
            pcVar15 = pcVar15 + 4;
          } while (1 < lVar16);
        }
        lVar16 = (long)pcVar1 - (long)pcVar13;
        if (lVar16 == 1) {
LAB_001417bc:
          pcVar15 = pcVar13;
          if ((byte)(*pcVar13 - 0x30U) < 10) {
            pcVar15 = pcVar1;
          }
        }
        else if (lVar16 == 2) {
LAB_001417af:
          pcVar15 = pcVar13;
          if ((byte)(*pcVar13 - 0x30U) < 10) {
            pcVar13 = pcVar13 + 1;
            goto LAB_001417bc;
          }
        }
        else {
          pcVar15 = pcVar1;
          if ((lVar16 == 3) && (pcVar15 = pcVar13, (byte)(*pcVar13 - 0x30U) < 10)) {
            pcVar13 = pcVar13 + 1;
            goto LAB_001417af;
          }
        }
LAB_001417dc:
        if (pcVar15 == pcVar1) {
LAB_00141929:
          _Var19 = std::from_chars<long>(__first,pcVar1,(long *)&local_58,10);
          bVar18 = _Var19.ptr != pcVar1;
          bVar9 = _Var19.ec != 0;
          if ((bVar9 || bVar18) || ((char *)0x1fffffffe < local_58._M_dataplus._M_p + 0xffffffff)) {
            prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (prVar12,
                       "script parse error: decimal numeric value only allowed in the range -0xFFFFFFFF...0xFFFFFFFF"
                      );
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            goto LAB_00141d22;
          }
          if (bVar9 || bVar18) {
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              std::__throw_bad_optional_access();
            }
            goto LAB_00141d22;
          }
          CScript::push_int64(__return_storage_ptr__,(int64_t)local_58._M_dataplus._M_p);
        }
        else {
          if ((uVar4 != 1) && (*__first == '-')) {
            lVar16 = (long)(uVar4 - 1) >> 2;
            pcVar13 = __first;
            if (0 < lVar16) {
              pcVar13 = __first + (uVar4 - 1 & 0xfffffffffffffffc);
              lVar16 = lVar16 + 1;
              pcVar15 = __first;
              do {
                pcVar14 = pcVar15 + 4;
                if (9 < (byte)(pcVar15[1] - 0x30U)) {
                  pcVar14 = pcVar15 + 1;
                  goto LAB_001418bb;
                }
                if (9 < (byte)(pcVar15[2] - 0x30U)) {
                  pcVar14 = pcVar15 + 2;
                  goto LAB_001418bb;
                }
                if (9 < (byte)(pcVar15[3] - 0x30U)) {
                  pcVar14 = pcVar15 + 3;
                  goto LAB_001418bb;
                }
                if (9 < (byte)(*pcVar14 - 0x30U)) goto LAB_001418bb;
                lVar16 = lVar16 + -1;
                pcVar15 = pcVar14;
              } while (1 < lVar16);
            }
            pcVar15 = pcVar13 + 1;
            lVar16 = (long)pcVar1 - (long)pcVar15;
            if (lVar16 == 1) {
LAB_0014189b:
              pcVar14 = pcVar15;
              if ((byte)(*pcVar15 - 0x30U) < 10) {
                pcVar14 = pcVar1;
              }
            }
            else if (lVar16 == 2) {
LAB_0014188e:
              pcVar14 = pcVar15;
              if ((byte)(*pcVar15 - 0x30U) < 10) {
                pcVar15 = pcVar15 + 1;
                goto LAB_0014189b;
              }
            }
            else {
              pcVar14 = pcVar1;
              if ((lVar16 == 3) && (pcVar14 = pcVar15, (byte)(*pcVar15 - 0x30U) < 10)) {
                pcVar15 = pcVar13 + 2;
                goto LAB_0014188e;
              }
            }
LAB_001418bb:
            if (pcVar14 == pcVar1) goto LAB_00141929;
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_58,this_00,0,2);
          iVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   compare(&local_58,"0x");
          if ((iVar10 == 0) && (2 < this_00->_M_string_length)) {
            pcVar5 = (this_00->_M_dataplus)._M_p;
            local_78 = local_68;
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((string *)&local_78,pcVar5 + 2,pcVar5 + this_00->_M_string_length);
            str._M_str = (char *)local_78;
            str._M_len = local_70;
            bVar9 = IsHex(str);
            bVar18 = true;
          }
          else {
            bVar18 = false;
            bVar9 = false;
          }
          if ((bVar18) && (local_78 != local_68)) {
            operator_delete(local_78,local_68[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != paVar2) {
            operator_delete(local_58._M_dataplus._M_p,
                            (ulong)(local_58.field_2._M_allocated_capacity + 1));
          }
          if (bVar9 == false) {
            if (((this_00->_M_string_length < 2) ||
                (pcVar1 = (this_00->_M_dataplus)._M_p, *pcVar1 != '\'')) ||
               (pcVar1[this_00->_M_string_length - 1] != '\'')) {
              if ((anonymous_namespace)::ParseOpCode(std::__cxx11::string_const&)::ocp == '\0') {
                this = (OpCodeParser *)
                       &(anonymous_namespace)::ParseOpCode(std::__cxx11::string_const&)::ocp;
                iVar10 = __cxa_guard_acquire();
                if (iVar10 != 0) {
                  anon_unknown.dwarf_156eb3::OpCodeParser::OpCodeParser(this);
                  __cxa_atexit(anon_unknown.dwarf_156eb3::OpCodeParser::~OpCodeParser,
                               (anonymous_namespace)::ParseOpCode(std::__cxx11::string_const&)::ocp,
                               &__dso_handle);
                  __cxa_guard_release(&(anonymous_namespace)::
                                       ParseOpCode(std::__cxx11::string_const&)::ocp);
                }
              }
              cVar11 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opcodetype>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opcodetype>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opcodetype>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opcodetype>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opcodetype>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opcodetype>_>_>
                               *)(anonymous_namespace)::ParseOpCode(std::__cxx11::string_const&)::
                                 ocp,this_00);
              if (cVar11._M_node !=
                  (_Base_ptr)
                  ((anonymous_namespace)::ParseOpCode(std::__cxx11::string_const&)::ocp + 8)) {
                CScript::operator<<(__return_storage_ptr__,cVar11._M_node[2]._M_color);
                goto LAB_00141ae0;
              }
              prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar12,"script parse error: unknown opcode");
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              goto LAB_00141d22;
            }
            pcVar5 = (this_00->_M_dataplus)._M_p;
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_58,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(pcVar5 + 1),
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(pcVar5 + (this_00->_M_string_length - 1)),(allocator_type *)&local_a8);
            b._M_extent._M_extent_value =
                 local_58._M_string_length - (long)local_58._M_dataplus._M_p;
            b._M_ptr = (pointer)local_58._M_dataplus._M_p;
            CScript::operator<<(__return_storage_ptr__,b);
            _Var7._M_p = local_58._M_dataplus._M_p;
            uVar8 = local_58.field_2._M_allocated_capacity;
          }
          else {
            pcVar5 = (this_00->_M_dataplus)._M_p;
            local_58._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((string *)&local_58,pcVar5 + 2,pcVar5 + this_00->_M_string_length);
            hex_str._M_str = local_58._M_dataplus._M_p;
            hex_str._M_len = local_58._M_string_length;
            ParseHex<unsigned_char>(&local_a8,hex_str);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != paVar2) {
              operator_delete(local_58._M_dataplus._M_p,
                              (ulong)(local_58.field_2._M_allocated_capacity + 1));
            }
            uVar3 = (__return_storage_ptr__->super_CScriptBase)._size;
            uVar6 = uVar3 - 0x1d;
            if (uVar3 < 0x1d) {
              uVar6 = uVar3;
            }
            pCVar17 = (CScript *)
                      (__return_storage_ptr__->super_CScriptBase)._union.indirect_contents.indirect;
            if (uVar3 < 0x1d) {
              pCVar17 = __return_storage_ptr__;
            }
            prevector<28U,_unsigned_char,_unsigned_int,_int>::
            insert<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      (&__return_storage_ptr__->super_CScriptBase,
                       (uchar *)((long)&(pCVar17->super_CScriptBase)._union + (long)(int)uVar6),
                       (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
            _Var7._M_p = (pointer)local_a8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start;
            uVar8 = local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var7._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(_Var7._M_p,uVar8 - (long)_Var7._M_p);
          }
        }
      }
LAB_00141ae0:
      this_00 = this_00 + 1;
    } while (this_00 !=
             local_90.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_00141d22:
  __stack_chk_fail();
}

Assistant:

CScript ParseScript(const std::string& s)
{
    CScript result;

    std::vector<std::string> words = SplitString(s, " \t\n");

    for (const std::string& w : words) {
        if (w.empty()) {
            // Empty string, ignore. (SplitString doesn't combine multiple separators)
        } else if (std::all_of(w.begin(), w.end(), ::IsDigit) ||
                   (w.front() == '-' && w.size() > 1 && std::all_of(w.begin() + 1, w.end(), ::IsDigit)))
        {
            // Number
            const auto num{ToIntegral<int64_t>(w)};

            // limit the range of numbers ParseScript accepts in decimal
            // since numbers outside -0xFFFFFFFF...0xFFFFFFFF are illegal in scripts
            if (!num.has_value() || num > int64_t{0xffffffff} || num < -1 * int64_t{0xffffffff}) {
                throw std::runtime_error("script parse error: decimal numeric value only allowed in the "
                                         "range -0xFFFFFFFF...0xFFFFFFFF");
            }

            result << num.value();
        } else if (w.substr(0, 2) == "0x" && w.size() > 2 && IsHex(std::string(w.begin() + 2, w.end()))) {
            // Raw hex data, inserted NOT pushed onto stack:
            std::vector<unsigned char> raw = ParseHex(std::string(w.begin() + 2, w.end()));
            result.insert(result.end(), raw.begin(), raw.end());
        } else if (w.size() >= 2 && w.front() == '\'' && w.back() == '\'') {
            // Single-quoted string, pushed as data. NOTE: this is poor-man's
            // parsing, spaces/tabs/newlines in single-quoted strings won't work.
            std::vector<unsigned char> value(w.begin() + 1, w.end() - 1);
            result << value;
        } else {
            // opcode, e.g. OP_ADD or ADD:
            result << ParseOpCode(w);
        }
    }

    return result;
}